

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O0

int alsa_stop_voice(ALLEGRO_VOICE *voice)

{
  long lVar1;
  long in_RDI;
  ALSA_VOICE *ex_data;
  
  lVar1 = *(long *)(in_RDI + 0x50);
  *(undefined1 *)(lVar1 + 0x11) = 1;
  al_signal_cond(*(undefined8 *)(in_RDI + 0x38));
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    *(undefined4 *)(*(long *)(in_RDI + 0x20) + 0xbc) = 0;
  }
  while (((*(byte *)(lVar1 + 0x12) ^ 0xff) & 1) != 0) {
    al_wait_cond(*(undefined8 *)(in_RDI + 0x38),*(undefined8 *)(in_RDI + 0x30));
  }
  return 0;
}

Assistant:

static int alsa_stop_voice(ALLEGRO_VOICE *voice)
{
   ALSA_VOICE *ex_data = voice->extra;

   /* We already hold voice->mutex. */
   ex_data->stop = true;
   al_signal_cond(voice->cond);

   if (!voice->is_streaming) {
      voice->attached_stream->pos = 0;
   }

   while (!ex_data->stopped) {
      al_wait_cond(voice->cond, voice->mutex);
   }

   return 0;
}